

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_xml.cc
# Opt level: O2

void __thiscall iqxmlrpc::Value_type_to_xml::do_visit_int64(Value_type_to_xml *this,int64_t val)

{
  long *in_RDX;
  int64_t local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_38 = val;
  boost::lexical_cast<std::__cxx11::string,long>(&local_30,(boost *)&local_38,in_RDX);
  add_textnode(this,"i8",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Value_type_to_xml::do_visit_int64(int64_t val)
{
  add_textnode("i8", boost::lexical_cast<std::string>(val));
}